

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool __thiscall google::protobuf::ValidateQualifiedName(protobuf *this,string_view name)

{
  protobuf pVar1;
  protobuf *ppVar2;
  const_iterator __begin2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  
  if (this == (protobuf *)0x0) {
    bVar3 = false;
  }
  else {
    ppVar2 = (protobuf *)0x0;
    bVar3 = false;
    do {
      pVar1 = ppVar2[name._M_len];
      if (((byte)(((byte)pVar1 & 0xdf) + 0xbf) < 0x1a) ||
         (pVar1 == (protobuf)0x5f || (byte)((char)pVar1 - 0x30U) < 10)) {
        bVar3 = false;
      }
      else {
        bVar4 = bVar3;
        if (!bVar3) {
          bVar4 = true;
        }
        if (pVar1 != (protobuf)0x2e) {
          return false;
        }
        bVar5 = bVar3 != false;
        bVar3 = bVar4;
        if (bVar5) {
          return false;
        }
      }
      ppVar2 = ppVar2 + 1;
    } while (this != ppVar2);
    bVar3 = (bool)(bVar3 ^ 1);
  }
  return bVar3;
}

Assistant:

static bool ValidateQualifiedName(absl::string_view name) {
  bool last_was_period = false;

  for (char character : name) {
    // I don't trust isalnum() due to locales.  :(
    if (('a' <= character && character <= 'z') ||
        ('A' <= character && character <= 'Z') ||
        ('0' <= character && character <= '9') || (character == '_')) {
      last_was_period = false;
    } else if (character == '.') {
      if (last_was_period) return false;
      last_was_period = true;
    } else {
      return false;
    }
  }

  return !name.empty() && !last_was_period;
}